

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

bool TranslateToC(CompilerContext *ctx,char *fileName,char *mainName,
                 _func_void_char_ptr *addDependency)

{
  _func_void_void_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  uint i;
  ulong uVar5;
  TraceScope traceScope;
  SmallArray<const_char_*,_32U> dependencies;
  ExpressionTranslateContext exprTranslateCtx;
  TraceScope TStack_2e8;
  SmallArray<const_char_*,_32U> local_2d8;
  ExpressionTranslateContext local_1c0;
  
  if ((TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))::token == '\0')
     && (iVar3 = __cxa_guard_acquire(&TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))
                                      ::token), iVar3 != 0)) {
    TranslateToC::token = NULLC::TraceGetToken("compiler","TranslateToC");
    __cxa_guard_release(&TranslateToC(CompilerContext&,char_const*,char_const*,void(*)(char_const*))
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&TStack_2e8,TranslateToC::token);
  if ((ctx->outputCtx).stream != (void *)0x0) {
    __assert_fail("!ctx.outputCtx.stream",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                  ,0x7f2,
                  "bool TranslateToC(CompilerContext &, const char *, const char *, void (*)(const char *))"
                 );
  }
  pvVar4 = (*(ctx->outputCtx).openStream)(fileName);
  (ctx->outputCtx).stream = pvVar4;
  if (pvVar4 == (void *)0x0) {
    bVar2 = false;
    NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,"ERROR: failed to open file");
  }
  else {
    local_1c0.output = &ctx->outputCtx;
    local_1c0.ctx = &ctx->exprCtx;
    local_2d8.allocator = ctx->allocator;
    local_1c0.loopBreakIdStack.data = local_1c0.loopBreakIdStack.little;
    local_1c0.loopBreakIdStack.count = 0;
    local_1c0.loopBreakIdStack.max = 0x20;
    local_1c0.loopContinueIdStack.data = local_1c0.loopContinueIdStack.little;
    local_1c0.loopContinueIdStack.count = 0;
    local_1c0.loopContinueIdStack.max = 0x20;
    local_1c0.indent = "\t";
    local_1c0.errorPos = (char *)0x0;
    local_1c0.nextLoopBreakId = 1;
    local_1c0.nextLoopContinueId = 1;
    local_1c0.nextReturnValueId = 1;
    local_1c0.skipFunctionDefinitions = false;
    local_1c0.currentFunction = (FunctionData *)0x0;
    local_1c0.errorBuf = ctx->errorBuf;
    local_1c0.depth = 0;
    local_1c0.errorBufSize = ctx->errorBufSize;
    local_2d8.data = local_2d8.little;
    local_2d8.count = 0;
    local_2d8.max = 0x20;
    local_1c0.mainName = mainName;
    local_1c0.loopBreakIdStack.allocator = local_2d8.allocator;
    local_1c0.loopContinueIdStack.allocator = local_2d8.allocator;
    local_1c0.allocator = local_2d8.allocator;
    bVar2 = TranslateModule(&local_1c0,ctx->exprModule,&local_2d8);
    pvVar4 = (ctx->outputCtx).stream;
    p_Var1 = (ctx->outputCtx).closeStream;
    if (bVar2) {
      (*p_Var1)(pvVar4);
      (ctx->outputCtx).stream = (void *)0x0;
      if ((addDependency != (_func_void_char_ptr *)0x0) && (local_2d8.count != 0)) {
        uVar5 = 0;
        do {
          (*addDependency)(local_2d8.data[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (local_2d8._8_8_ & 0xffffffff));
      }
    }
    else {
      (*p_Var1)(pvVar4);
      (ctx->outputCtx).stream = (void *)0x0;
    }
    SmallArray<const_char_*,_32U>::~SmallArray(&local_2d8);
    SmallArray<unsigned_int,_32U>::~SmallArray(&local_1c0.loopContinueIdStack);
    SmallArray<unsigned_int,_32U>::~SmallArray(&local_1c0.loopBreakIdStack);
  }
  NULLC::TraceScope::~TraceScope(&TStack_2e8);
  return bVar2;
}

Assistant:

bool TranslateToC(CompilerContext &ctx, const char *fileName, const char *mainName, void (*addDependency)(const char *fileName))
{
	TRACE_SCOPE("compiler", "TranslateToC");

	assert(!ctx.outputCtx.stream);
	ctx.outputCtx.stream = ctx.outputCtx.openStream(fileName);

	if(!ctx.outputCtx.stream)
	{
		NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: failed to open file");
		return false;
	}

	ExpressionTranslateContext exprTranslateCtx(ctx.exprCtx, ctx.outputCtx, ctx.allocator);

	exprTranslateCtx.mainName = mainName;

	exprTranslateCtx.errorBuf = ctx.errorBuf;
	exprTranslateCtx.errorBufSize = ctx.errorBufSize;

	SmallArray<const char*, 32> dependencies(ctx.allocator);

	if(!TranslateModule(exprTranslateCtx, ctx.exprModule, dependencies))
	{
		ctx.outputCtx.closeStream(ctx.outputCtx.stream);
		ctx.outputCtx.stream = NULL;

		return false;
	}

	ctx.outputCtx.closeStream(ctx.outputCtx.stream);
	ctx.outputCtx.stream = NULL;

	if(addDependency)
	{
		for(unsigned i = 0; i < dependencies.size(); i++)
			addDependency(dependencies[i]);
	}

	return true;
}